

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_mcan(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint32_t nbtp;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%08x",(ulong)((*(int *)(in_RDI + 0x1c) - 1U & 0x1ff) << 0x10 |
                            (*(int *)(in_RDI + 0x18) + -1) * 0x2000000 |
                            ((*(int *)(in_RDI + 0xc) + *(int *)(in_RDI + 0x10)) - 1U & 0xff) << 8 |
                           *(int *)(in_RDI + 0x14) - 1U & 0x7f));
  }
  else {
    printf("%10s","NBTP");
  }
  return;
}

Assistant:

static void printf_btr_mcan(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "NBTP");
	} else {
		uint32_t nbtp;


		nbtp = (((bt->brp -1) & 0x1ff) << 16) |
			(((bt->sjw -1) & 0x7f) << 25) |
			(((bt->prop_seg + bt->phase_seg1 -1) & 0xff) << 8) |
			(((bt->phase_seg2 -1) & 0x7f) << 0);

		printf("0x%08x", nbtp);
	}
}